

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptor::GetLocationPath
          (ServiceDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_14;
  
  std::vector<int,_std::allocator<int>_>::push_back
            (output,&FileDescriptorProto::kServiceFieldNumber);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_14);
  return;
}

Assistant:

void ServiceDescriptor::GetLocationPath(vector<int>* output) const {
  output->push_back(FileDescriptorProto::kServiceFieldNumber);
  output->push_back(index());
}